

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cc
# Opt level: O2

void lrit::to_json(json *j,ImageDataFunctionHeader *h)

{
  istringstream iVar1;
  value_t vVar2;
  uint uVar3;
  number_unsigned_t nVar4;
  json_value jVar5;
  uint uVar6;
  istream *piVar7;
  reference pvVar8;
  float fVar9;
  string k;
  string v;
  json map;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  local_780;
  string str;
  string line;
  istringstream lss;
  json_value local_728;
  istringstream iss;
  array<float,_256UL> table;
  
  str._M_dataplus._M_p = (pointer)&str.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&str,
             (h->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start,
             (h->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::basic_json(&map,(nullptr_t)0x0);
  std::__cxx11::istringstream::istringstream((istringstream *)&iss,(string *)&str,_S_in);
  line._M_dataplus._M_p = (pointer)&line.field_2;
  line._M_string_length = 0;
  line.field_2._M_local_buf[0] = '\0';
  do {
    piVar7 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)&iss,(string *)&line,'\n');
    uVar3 = *(uint *)(&piVar7->field_0x20 + (long)piVar7->_vptr_basic_istream[-3]);
    if ((uVar3 & 5) != 0) {
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                    *)&lss,&map);
      pvVar8 = nlohmann::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                           *)j,"Map");
      iVar1 = (istringstream)pvVar8->m_type;
      pvVar8->m_type = (value_t)lss;
      pvVar8->m_value = local_728;
      lss = iVar1;
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                     *)&lss);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::basic_json<std::array<float,_256UL>_&,_std::array<float,_256UL>,_0>
                ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                  *)&k,&table);
      pvVar8 = nlohmann::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                           *)j,"Table");
      vVar2 = pvVar8->m_type;
      pvVar8->m_type = (value_t)k._M_dataplus._M_p;
      k._M_dataplus._M_p._0_1_ = vVar2;
      nVar4 = (pvVar8->m_value).number_unsigned;
      (pvVar8->m_value).number_unsigned = k._M_string_length;
      k._M_string_length = nVar4;
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                     *)&k);
LAB_00196b80:
      std::__cxx11::string::~string((string *)&line);
      std::__cxx11::istringstream::~istringstream((istringstream *)&iss);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::~basic_json(&map);
      if ((uVar3 & 5) == 0) {
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::
        basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                  (&local_780,&str);
        pvVar8 = nlohmann::
                 basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                 ::operator[]<char_const>
                           ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                             *)j,"Original");
        vVar2 = pvVar8->m_type;
        pvVar8->m_type = local_780.m_type;
        jVar5 = pvVar8->m_value;
        pvVar8->m_value = local_780.m_value;
        local_780.m_type = vVar2;
        local_780.m_value = jVar5;
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::~basic_json(&local_780);
      }
      std::__cxx11::string::~string((string *)&str);
      return;
    }
    std::__cxx11::istringstream::istringstream((istringstream *)&lss,(string *)&line,_S_in);
    k._M_dataplus._M_p = (pointer)&k.field_2;
    k._M_string_length = 0;
    k.field_2._M_local_buf[0] = '\0';
    v._M_dataplus._M_p = (pointer)&v.field_2;
    v._M_string_length = 0;
    v.field_2._M_local_buf[0] = '\0';
    std::getline<char,std::char_traits<char>,std::allocator<char>>((istream *)&lss,(string *)&k,'=')
    ;
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)&lss,(string *)&v,'\n');
    std::__cxx11::string::erase(&k);
    if ((k._M_string_length == 0) || (v._M_string_length == 0)) {
LAB_00196acf:
      std::__cxx11::string::~string((string *)&v);
      std::__cxx11::string::~string((string *)&k);
      std::__cxx11::istringstream::~istringstream((istringstream *)&lss);
      goto LAB_00196b80;
    }
    uVar6 = std::__cxx11::stoi(&k,(size_t *)0x0,10);
    fVar9 = std::__cxx11::stof(&v,(size_t *)0x0);
    if (0xff < uVar6) goto LAB_00196acf;
    table._M_elems[uVar6] = fVar9;
    std::__cxx11::string::~string((string *)&v);
    std::__cxx11::string::~string((string *)&k);
    std::__cxx11::istringstream::~istringstream((istringstream *)&lss);
  } while( true );
}

Assistant:

void to_json(json& j, const ImageDataFunctionHeader& h) {
  const auto str = std::string((const char*)h.data.data(), h.data.size());
  if (!tryDecodeImageDataFunctionHeader(j, str)) {
    j["Original"] = str;
  }
}